

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

void __thiscall
Assimp::MD5Importer::AttachChilds_Anim
          (MD5Importer *this,int iParentID,aiNode *piParent,AnimBoneList *bones,
          aiNodeAnim **node_anims)

{
  aiNodeAnim **ppaVar1;
  pointer pAVar2;
  bool bVar3;
  aiNode **ppaVar4;
  aiNode *this_00;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong __n;
  aiNodeAnim **ppaVar8;
  aiMatrix4x4t<float> temp;
  aiMatrix3x3t<float> local_4a0;
  aiMatrix3x3t<float> local_478;
  float fStack_454;
  float local_450;
  undefined8 local_44c;
  undefined8 uStack_444;
  undefined4 local_43c;
  aiMatrix4x4t<float> local_438 [16];
  
  if ((piParent != (aiNode *)0x0) && (piParent->mNumChildren == 0)) {
    uVar5 = 0;
    lVar6 = 0x404;
    for (uVar7 = 0;
        pAVar2 = (bones->
                 super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        (long)uVar7 <
        (long)(int)(((long)(bones->
                           super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x410);
        uVar7 = uVar7 + 1) {
      if (((uint)iParentID != uVar7) &&
         (*(int *)((long)(pAVar2->super_BaseJointDescription).mName.data +
                  lVar6 + 0xfffffffffffffffcU) == iParentID)) {
        uVar5 = uVar5 + 1;
        piParent->mNumChildren = uVar5;
      }
      lVar6 = lVar6 + 0x410;
    }
    if (uVar5 != 0) {
      ppaVar4 = (aiNode **)operator_new__((ulong)uVar5 << 3);
      piParent->mChildren = ppaVar4;
      for (uVar7 = 0;
          pAVar2 = (bones->
                   super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          (long)uVar7 <
          (long)(int)(((long)(bones->
                             super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x410);
          uVar7 = uVar7 + 1) {
        if ((uVar7 != (uint)iParentID) &&
           (pAVar2[uVar7].super_BaseJointDescription.mParentIndex == iParentID)) {
          this_00 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_00);
          ppaVar4 = piParent->mChildren;
          piParent->mChildren = ppaVar4 + 1;
          *ppaVar4 = this_00;
          pAVar2 = (bones->
                   super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar7;
          uVar5 = (pAVar2->super_BaseJointDescription).mName.length;
          if (0x3fe < uVar5) {
            uVar5 = 0x3ff;
          }
          __n = (ulong)uVar5;
          memcpy(&local_438[0].a2,(pAVar2->super_BaseJointDescription).mName.data,__n);
          *(undefined1 *)((long)&local_438[0].a2 + __n) = 0;
          (this_00->mName).length = uVar5;
          memcpy((this_00->mName).data,&local_438[0].a2,__n);
          (this_00->mName).data[__n] = '\0';
          this_00->mParent = piParent;
          ppaVar8 = node_anims + -1;
          do {
            ppaVar1 = ppaVar8 + 1;
            ppaVar8 = ppaVar8 + 1;
            bVar3 = aiString::operator!=(&(*ppaVar1)->mNodeName,(aiString *)this_00);
          } while (bVar3);
          aiMatrix4x4t<float>::Translation
                    (&(*ppaVar8)->mPositionKeys->mValue,&this_00->mTransformation);
          aiQuaterniont<float>::GetMatrix(&local_4a0,&(*ppaVar8)->mRotationKeys->mValue);
          local_478.a1 = local_4a0.a1;
          local_478.a2 = local_4a0.a2;
          local_478.a3 = local_4a0.a3;
          local_478.b1 = 0.0;
          local_478.b2 = local_4a0.b1;
          local_478.b3 = local_4a0.b2;
          local_478.c1 = local_4a0.b3;
          local_478.c2 = 0.0;
          local_478.c3 = local_4a0.c1;
          fStack_454 = local_4a0.c2;
          local_450 = local_4a0.c3;
          local_44c = 0;
          uStack_444 = 0;
          local_43c = 0x3f800000;
          local_438[0].a1 = (this_00->mTransformation).a1;
          local_438[0].a2 = (this_00->mTransformation).a2;
          local_438[0].a3 = (this_00->mTransformation).a3;
          local_438[0].a4 = (this_00->mTransformation).a4;
          local_438[0].b1 = (this_00->mTransformation).b1;
          local_438[0].b2 = (this_00->mTransformation).b2;
          local_438[0].b3 = (this_00->mTransformation).b3;
          local_438[0].b4 = (this_00->mTransformation).b4;
          local_438[0].c1 = (this_00->mTransformation).c1;
          local_438[0].c2 = (this_00->mTransformation).c2;
          local_438[0].c3 = (this_00->mTransformation).c3;
          local_438[0].c4 = (this_00->mTransformation).c4;
          local_438[0].d1 = (this_00->mTransformation).d1;
          local_438[0].d2 = (this_00->mTransformation).d2;
          local_438[0].d3 = (this_00->mTransformation).d3;
          local_438[0].d4 = (this_00->mTransformation).d4;
          aiMatrix4x4t<float>::operator*=(local_438,(aiMatrix4x4t<float> *)&local_478);
          (this_00->mTransformation).a1 = local_438[0].a1;
          (this_00->mTransformation).a2 = local_438[0].a2;
          (this_00->mTransformation).a3 = local_438[0].a3;
          (this_00->mTransformation).a4 = local_438[0].a4;
          (this_00->mTransformation).b1 = local_438[0].b1;
          (this_00->mTransformation).b2 = local_438[0].b2;
          (this_00->mTransformation).b3 = local_438[0].b3;
          (this_00->mTransformation).b4 = local_438[0].b4;
          (this_00->mTransformation).c1 = local_438[0].c1;
          (this_00->mTransformation).c2 = local_438[0].c2;
          (this_00->mTransformation).c3 = local_438[0].c3;
          (this_00->mTransformation).c4 = local_438[0].c4;
          (this_00->mTransformation).d1 = local_438[0].d1;
          (this_00->mTransformation).d2 = local_438[0].d2;
          (this_00->mTransformation).d3 = local_438[0].d3;
          (this_00->mTransformation).d4 = local_438[0].d4;
          AttachChilds_Anim(this,(int)uVar7,this_00,bones,node_anims);
        }
      }
      piParent->mChildren = piParent->mChildren + -(ulong)piParent->mNumChildren;
    }
    return;
  }
  __assert_fail("__null != piParent && !piParent->mNumChildren",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD5/MD5Loader.cpp"
                ,0x13e,
                "void Assimp::MD5Importer::AttachChilds_Anim(int, aiNode *, AnimBoneList &, const aiNodeAnim **)"
               );
}

Assistant:

void MD5Importer::AttachChilds_Anim(int iParentID,aiNode* piParent, AnimBoneList& bones,const aiNodeAnim** node_anims)
{
    ai_assert(NULL != piParent && !piParent->mNumChildren);

    // First find out how many children we'll have
    for (int i = 0; i < (int)bones.size();++i)  {
        if (iParentID != i && bones[i].mParentIndex == iParentID)   {
            ++piParent->mNumChildren;
        }
    }
    if (piParent->mNumChildren) {
        piParent->mChildren = new aiNode*[piParent->mNumChildren];
        for (int i = 0; i < (int)bones.size();++i)  {
            // (avoid infinite recursion)
            if (iParentID != i && bones[i].mParentIndex == iParentID)
            {
                aiNode* pc;
                // setup a new node
                *piParent->mChildren++ = pc = new aiNode();
                pc->mName = aiString(bones[i].mName);
                pc->mParent = piParent;

                // get the corresponding animation channel and its first frame
                const aiNodeAnim** cur = node_anims;
                while ((**cur).mNodeName != pc->mName)++cur;

                aiMatrix4x4::Translation((**cur).mPositionKeys[0].mValue,pc->mTransformation);
                pc->mTransformation = pc->mTransformation * aiMatrix4x4((**cur).mRotationKeys[0].mValue.GetMatrix()) ;

                // add children to this node, too
                AttachChilds_Anim( i, pc, bones,node_anims);
            }
        }
        // undo offset computations
        piParent->mChildren -= piParent->mNumChildren;
    }
}